

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool tinyobj::parseVertexWithColor
               (real_t *x,real_t *y,real_t *z,real_t *r,real_t *g,real_t *b,char **token,
               double default_x,double default_y,double default_z)

{
  bool bVar1;
  real_t rVar2;
  undefined1 local_52;
  bool found_color;
  double default_z_local;
  double default_y_local;
  double default_x_local;
  real_t *b_local;
  real_t *g_local;
  real_t *r_local;
  real_t *z_local;
  real_t *y_local;
  real_t *x_local;
  
  rVar2 = parseReal(token,default_x);
  *x = rVar2;
  rVar2 = parseReal(token,default_y);
  *y = rVar2;
  rVar2 = parseReal(token,default_z);
  *z = rVar2;
  bVar1 = parseReal(token,r);
  local_52 = false;
  if (bVar1) {
    bVar1 = parseReal(token,g);
    local_52 = false;
    if (bVar1) {
      local_52 = parseReal(token,b);
    }
  }
  if (local_52 == false) {
    *b = 1.0;
    *g = 1.0;
    *r = 1.0;
  }
  return local_52;
}

Assistant:

static inline bool parseVertexWithColor(real_t *x, real_t *y, real_t *z,
                                        real_t *r, real_t *g, real_t *b,
                                        const char **token,
                                        const double default_x = 0.0,
                                        const double default_y = 0.0,
                                        const double default_z = 0.0) {
  (*x) = parseReal(token, default_x);
  (*y) = parseReal(token, default_y);
  (*z) = parseReal(token, default_z);

  const bool found_color =
      parseReal(token, r) && parseReal(token, g) && parseReal(token, b);

  if (!found_color) {
    (*r) = (*g) = (*b) = 1.0;
  }

  return found_color;
}